

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnVoteKick
          (RenX_LoggingPlugin *this,Server *server,TeamType *param_2,PlayerInfo *player,
          PlayerInfo *victim)

{
  code *pcVar1;
  string msg;
  undefined8 local_48;
  long local_40;
  
  if ((this->field_0xa8 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_48,&this->voteKickFmt);
  if (local_40 != 0) {
    RenX::processTags((string *)&local_48,server,player,victim,(BuildingInfo *)0x0);
    (*pcVar1)(server,local_40,local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVoteKick(RenX::Server &server, const RenX::TeamType &, const RenX::PlayerInfo &player, const RenX::PlayerInfo &victim)
{
	logFuncType func;
	if (RenX_LoggingPlugin::voteCallPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->voteKickFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &victim);
		(server.*func)(msg);
	}
}